

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpToNoAbort(WebSocketPipeImpl *this,WebSocket *other)

{
  Coroutine<void> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  undefined8 uVar4;
  void *pvVar5;
  long *in_RDX;
  PromiseAwaiter<void> *pPVar6;
  
  handle._M_fr_ptr = operator_new(0x5f0);
  *(code **)handle._M_fr_ptr = pumpToNoAbort;
  *(code **)((long)handle._M_fr_ptr + 8) = pumpToNoAbort;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  location.function = "pumpToNoAbort";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf55;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  pp_Var2 = other[5]._vptr_WebSocket;
  if (pp_Var2 == (_func_int **)0x0) {
    pvVar5 = operator_new(0x400);
    pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5e0);
    *(undefined8 *)((long)pvVar5 + 0x220) = 0;
    *(undefined ***)((long)pvVar5 + 0x210) = &PTR_destroy_0066dc48;
    *(undefined ***)((long)pvVar5 + 0x228) = &PTR_reject_0066dc98;
    *(undefined1 *)((long)pvVar5 + 0x230) = 0;
    *(undefined1 *)((long)pvVar5 + 0x3c8) = 0;
    *(undefined1 *)((long)pvVar5 + 0x3d0) = 1;
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_send_0066dcf8;
    *(long *)((long)pvVar5 + 0x3e0) = (long)pvVar5 + 0x228;
    *(WebSocket **)((long)pvVar5 + 1000) = other;
    *(long **)((long)pvVar5 + 0x3f0) = in_RDX;
    *(undefined8 *)((long)pvVar5 + 0x3f8) = 0;
    other[5]._vptr_WebSocket = (_func_int **)((long)pvVar5 + 0x3d8);
    *(void **)((long)pvVar5 + 0x218) = pvVar5;
    pOVar1->ptr = (PromiseNode *)((long)pvVar5 + 0x210);
    ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c8))->ptr =
         (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c8));
    pPVar6 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
    co_await<void>(pPVar6,(Promise<void> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar6,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar6);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar6);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
  }
  else {
    uVar4 = (**(code **)(*in_RDX + 0x50))();
    pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5d8);
    *(undefined8 *)((long)handle._M_fr_ptr + 0x5d0) = uVar4;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5a8) = 1;
    *(WebSocket **)((long)handle._M_fr_ptr + 0x5b0) = other;
    *(long **)((long)handle._M_fr_ptr + 0x5b8) = in_RDX;
    *(long *)((long)handle._M_fr_ptr + 0x5c0) = (long)handle._M_fr_ptr + 0x5d0;
    (**(code **)(*pp_Var2 + 0x38))(pOVar1,pp_Var2);
    pPVar6 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(pPVar6,(Promise<void> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar6,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar6);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar6);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3928:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3928:7)>
                 *)((long)handle._M_fr_ptr + 0x5a8));
  }
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpToNoAbort(WebSocket& other) {
    KJ_IF_SOME(s, state) {
      auto before = other.receivedByteCount();
      KJ_DEFER(transferredBytes += other.receivedByteCount() - before);
      co_await s.pumpTo(other);
    } else {
      co_await newAdaptedPromise<void, BlockedPumpTo>(*this, other);
    }
  }